

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O1

string * QUtil::hex_decode(string *__return_storage_ptr__,string *input)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  bool bVar4;
  byte bVar5;
  size_type sVar6;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar2 = input->_M_string_length;
  if (sVar2 == 0) {
    bVar4 = true;
  }
  else {
    pcVar3 = (input->_M_dataplus)._M_p;
    bVar4 = true;
    sVar6 = 0;
    do {
      cVar1 = pcVar3[sVar6];
      bVar5 = cVar1 - 0x30;
      if (9 < bVar5) {
        if (cVar1 < 'a') {
          bVar5 = cVar1 - 0x37;
          if (cVar1 < 'A') {
            bVar5 = 0x10;
          }
        }
        else {
          bVar5 = cVar1 + 0xa9;
        }
      }
      if ((char)bVar5 < '\x10') {
        if (bVar4) {
          bVar4 = false;
        }
        else {
          bVar4 = true;
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
      }
      sVar6 = sVar6 + 1;
    } while (sVar2 != sVar6);
  }
  if (!bVar4) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::hex_decode(std::string const& input)
{
    std::string result;
    // We know result.size() <= 0.5 * input.size() + 1. However, reserving string space for this
    // upper bound has a negative impact.
    bool first = true;
    char decoded;
    for (auto ch: input) {
        ch = util::hex_decode_char(ch);
        if (ch < '\20') {
            if (first) {
                decoded = static_cast<char>(ch << 4);
                first = false;
            } else {
                result.push_back(decoded | ch);
                first = true;
            }
        }
    }
    if (!first) {
        result.push_back(decoded);
    }
    return result;
}